

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

optional<tinyusdz::value::matrix4d> * __thiscall
tinyusdz::XformOp::get_value<tinyusdz::value::matrix4d>
          (optional<tinyusdz::value::matrix4d> *__return_storage_ptr__,XformOp *this,double t,
          TimeSampleInterpolationType interp)

{
  bool bVar1;
  long lVar2;
  optional<tinyusdz::value::matrix4d> *poVar3;
  storage_t<tinyusdz::value::matrix4d> *psVar4;
  PrimVar *this_00;
  byte bVar5;
  matrix4d value;
  optional<tinyusdz::value::matrix4d> local_a8;
  
  bVar5 = 0;
  this_00 = &this->_var;
  bVar1 = primvar::PrimVar::is_timesamples(this_00);
  if (bVar1) {
    local_a8.has_value_ = false;
    local_a8._1_7_ = 0x3ff00000000000;
    local_a8.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    local_a8.contained._8_8_ = 0;
    local_a8.contained._16_8_ = 0;
    local_a8.contained._24_8_ = 0;
    local_a8.contained._32_8_ = 0x3ff0000000000000;
    local_a8.contained._40_8_ = 0;
    local_a8.contained._48_8_ = 0;
    local_a8.contained._56_8_ = 0;
    local_a8.contained._64_8_ = 0;
    local_a8.contained._72_8_ = 0x3ff0000000000000;
    local_a8.contained._80_8_ = 0;
    local_a8.contained._88_8_ = 0;
    local_a8.contained._96_8_ = 0;
    local_a8.contained._104_8_ = 0;
    local_a8.contained._112_8_ = 0x3ff0000000000000;
    bVar1 = primvar::PrimVar::get_interpolated_value<tinyusdz::value::matrix4d>
                      (this_00,t,interp,(matrix4d *)&local_a8);
    if (!bVar1) {
      __return_storage_ptr__->has_value_ = false;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x70) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x78) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x60) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x68) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x50) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x58) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x40) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x48) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x30) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x38) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x28) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
      *(undefined8 *)&__return_storage_ptr__->contained = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->has_value_ = true;
    poVar3 = &local_a8;
  }
  else {
    primvar::PrimVar::get_value<tinyusdz::value::matrix4d>(&local_a8,this_00);
    __return_storage_ptr__->has_value_ = local_a8.has_value_;
    if (local_a8.has_value_ != true) {
      return __return_storage_ptr__;
    }
    poVar3 = (optional<tinyusdz::value::matrix4d> *)&local_a8.contained;
  }
  psVar4 = &__return_storage_ptr__->contained;
  for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *(undefined8 *)psVar4 = *(undefined8 *)poVar3;
    poVar3 = (optional<tinyusdz::value::matrix4d> *)((long)poVar3 + ((ulong)bVar5 * -2 + 1) * 8);
    psVar4 = (storage_t<tinyusdz::value::matrix4d> *)((long)psVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value(double t = value::TimeCode::Default(), 
          value::TimeSampleInterpolationType interp =
               value::TimeSampleInterpolationType::Linear) const {
    if (is_timesamples()) {
      T value;
      if (get_interpolated_value(&value, t, interp)) {
        return value;
      }
      return nonstd::nullopt;
    }

    return _var.get_value<T>();
  }